

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ssize_t sVar4;
  char *pcVar5;
  char **in_RSI;
  int in_EDI;
  uint __errnum;
  int i;
  int fdmodidx;
  int modidx;
  fdmodattr fdmodmsg [4];
  modattr modmsg [4];
  char crc8tab [513];
  cgw_csum_crc8 cs_crc8;
  cgw_csum_xor cs_xor;
  sockaddr_nl nladdr;
  can_filter filter;
  int len;
  __u16 flags;
  __u8 limit_hops;
  __u32 uid;
  uint dst_ifindex;
  uint src_ifindex;
  nlmsgerr *rte;
  nlmsghdr *nlh;
  uchar rxbuf [8192];
  anon_struct_1520_3_441c1061 req;
  int have_cs_crc8;
  int have_cs_xor;
  int have_filter;
  int cmd;
  int opt;
  int err;
  int s;
  int len_00;
  uchar *in_stack_ffffffffffffd4b0;
  char *in_stack_ffffffffffffd4b8;
  cgw_csum_crc8 *in_stack_ffffffffffffd4c0;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffd4c8;
  undefined4 in_stack_ffffffffffffd4cc;
  modattr *in_stack_ffffffffffffd4e0;
  undefined4 in_stack_ffffffffffffd4e8;
  undefined4 in_stack_ffffffffffffd4ec;
  int local_2b10;
  int local_2b0c;
  int in_stack_ffffffffffffd50c;
  uchar *in_stack_ffffffffffffd510;
  char *in_stack_ffffffffffffd518;
  fdmodattr *in_stack_ffffffffffffd550;
  char *in_stack_ffffffffffffd558;
  uchar local_2988 [522];
  undefined1 local_277e;
  undefined1 uStack_277d;
  undefined1 uStack_277c;
  undefined1 uStack_277b;
  undefined1 auStack_277a [278];
  undefined1 local_2664;
  undefined1 uStack_2663;
  undefined1 uStack_2662;
  undefined1 uStack_2661;
  sockaddr local_2660;
  undefined1 auStack_2650 [4];
  int local_264c;
  ushort local_2648;
  char local_2645;
  int local_2644;
  uint local_2640;
  uint local_263c;
  uint *local_2638;
  undefined1 *local_2630;
  undefined1 local_2628 [4];
  ushort local_2624;
  uint local_2618 [2047];
  uint local_61c;
  undefined2 local_618;
  undefined2 local_616;
  undefined4 local_614;
  undefined1 local_60c;
  undefined1 local_60b;
  ushort local_60a;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_263c = 0;
  local_2640 = 0;
  local_2644 = 0;
  local_2645 = '\0';
  local_2648 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_2664,0,4);
  memset(&local_277e,0,0x11a);
  memset(local_2988,0,0x201);
  local_2b0c = 0;
  local_2b10 = 0;
  memset(&local_61c,0,0x5f0);
  while (local_1c = getopt(local_8,local_10,"ADFLs:d:Xteiu:l:f:c:p:x:m:M:?"), local_1c != 0xffffffff
        ) {
    switch(local_1c) {
    case 0x3f:
      __xpg_basename(*local_10);
      print_usage((char *)0x1018a5);
      exit(0);
    default:
      fprintf(_stderr,"Unknown option %c\n",(ulong)local_1c);
      __xpg_basename(*local_10);
      print_usage((char *)0x1018e3);
      exit(1);
    case 0x41:
      if (local_20 == 0) {
        local_20 = 1;
      }
      break;
    case 0x44:
      if (local_20 == 0) {
        local_20 = 2;
      }
      break;
    case 0x46:
      if (local_20 == 0) {
        local_20 = 3;
      }
      break;
    case 0x4c:
      if (local_20 == 0) {
        local_20 = 4;
      }
      break;
    case 0x4d:
      if (local_2b10 < 4) {
        local_2b10 = local_2b10 + 1;
        local_18 = parse_fdmod(in_stack_ffffffffffffd558,in_stack_ffffffffffffd550);
        if (local_18 != 0) {
          printf("Problem %d with modification definition \'%s\'.\n",(ulong)local_18,_optarg);
          exit(1);
        }
      }
      break;
    case 0x58:
      local_2648 = local_2648 | 8;
      break;
    case 99:
      len_00 = (int)((ulong)auStack_277a >> 0x20);
      in_stack_ffffffffffffd4b0 = local_2988;
      iVar1 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx:%hhx:%512s",&local_277e,&uStack_277d,
                              &uStack_277c,&uStack_277b);
      if (((iVar1 != 6) || (sVar3 = strlen((char *)local_2988), sVar3 != 0x200)) ||
         (iVar1 = b64hex(in_stack_ffffffffffffd4b8,in_stack_ffffffffffffd4b0,len_00), iVar1 != 0)) {
        printf("Bad CRC8 checksum definition \'%s\'.\n",_optarg);
        exit(1);
      }
      local_2c = 1;
      break;
    case 100:
      local_2640 = if_nametoindex(_optarg);
      if (local_2640 == 0) {
        perror("dst if_nametoindex");
        exit(1);
      }
      break;
    case 0x65:
      local_2648 = local_2648 | 1;
      break;
    case 0x66:
      iVar1 = __isoc99_sscanf(_optarg,"%x:%x",local_2660.sa_data + 10,auStack_2650);
      if (iVar1 != 2) {
        iVar1 = __isoc99_sscanf(_optarg,"%x~%x",local_2660.sa_data + 10,auStack_2650);
        if (iVar1 != 2) {
          printf("Bad filter definition \'%s\'.\n",_optarg);
          exit(1);
        }
        local_2660.sa_data._10_4_ = local_2660.sa_data._10_4_ | 0x20000000;
      }
      local_24 = 1;
      break;
    case 0x69:
      local_2648 = local_2648 | 4;
      break;
    case 0x6c:
      iVar1 = __isoc99_sscanf(_optarg,"%hhu",&local_2645);
      if ((iVar1 != 1) || (local_2645 == '\0')) {
        printf("Bad hop limit definition \'%s\'.\n",_optarg);
        exit(1);
      }
      break;
    case 0x6d:
      if (local_2b0c < 4) {
        local_2b0c = local_2b0c + 1;
        local_18 = parse_mod((char *)CONCAT44(in_stack_ffffffffffffd4ec,in_stack_ffffffffffffd4e8),
                             in_stack_ffffffffffffd4e0);
        if (local_18 != 0) {
          printf("Problem %d with modification definition \'%s\'.\n",(ulong)local_18,_optarg);
          exit(1);
        }
      }
      break;
    case 0x70:
      iVar1 = parse_crc8_profile((char *)CONCAT44(in_stack_ffffffffffffd4cc,
                                                  in_stack_ffffffffffffd4c8),
                                 in_stack_ffffffffffffd4c0);
      if (iVar1 != 0) {
        printf("Bad CRC8 profile definition \'%s\'.\n",_optarg);
        exit(1);
      }
      break;
    case 0x73:
      local_263c = if_nametoindex(_optarg);
      if (local_263c == 0) {
        perror("src if_nametoindex");
        exit(1);
      }
      break;
    case 0x74:
      local_2648 = local_2648 | 2;
      break;
    case 0x75:
      uVar2 = strtoul(_optarg,(char **)0x0,0x10);
      local_2644 = (int)uVar2;
      break;
    case 0x78:
      iVar1 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx",&local_2664,&uStack_2663,&uStack_2662,
                              &uStack_2661);
      if (iVar1 != 4) {
        printf("Bad XOR checksum definition \'%s\'.\n",_optarg);
        exit(1);
      }
      local_28 = 1;
    }
  }
  if ((local_8 != _optind) || (local_20 == 0)) {
    __xpg_basename(*local_10);
    print_usage((char *)0x101929);
    exit(1);
  }
  if (((local_20 == 1) || (local_20 == 2)) && ((local_263c == 0 || (local_2640 == 0)))) {
    __xpg_basename(*local_10);
    print_usage((char *)0x101973);
    exit(1);
  }
  if ((local_2648 & 8) == 0) {
    if (local_2b10 != 0) {
      printf("No -M modifications allowed in Classic CAN mode!\n");
      exit(1);
    }
  }
  else if (local_2b0c != 0) {
    printf("No -m modifications allowed in CAN FD mode!\n");
    exit(1);
  }
  if (((local_2b0c == 0) && (local_2b10 == 0)) && ((local_2c != 0 || (local_28 != 0)))) {
    printf("-c or -x can only be used in conjunction with -m/-M\n");
    exit(1);
  }
  local_14 = socket(0x10,3,0);
  switch(local_20) {
  case 1:
    local_616 = 5;
    local_618 = 0x18;
    break;
  case 2:
    local_616 = 5;
    local_618 = 0x19;
    break;
  case 3:
    local_616 = 5;
    local_618 = 0x19;
    local_263c = 0;
    local_2640 = 0;
    break;
  case 4:
    local_616 = 0x301;
    local_618 = 0x1a;
    break;
  default:
    printf("This function is not yet implemented.\n");
    exit(1);
  }
  local_61c = 0x14;
  local_614 = 0;
  local_60c = 0x1d;
  local_60b = 1;
  local_60a = local_2648;
  addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
            (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
            in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
            (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
            in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  if (local_24 != 0) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  if (local_2c != 0) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  if (local_28 != 0) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  if (local_2644 != 0) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  if (local_2645 != '\0') {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  for (iVar1 = 0; iVar1 < local_2b0c; iVar1 = iVar1 + 1) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  for (iVar1 = 0; iVar1 < local_2b10; iVar1 = iVar1 + 1) {
    addattr_l((nlmsghdr *)CONCAT44(in_stack_ffffffffffffd4cc,in_stack_ffffffffffffd4c8),
              (int)((ulong)in_stack_ffffffffffffd4c0 >> 0x20),(int)in_stack_ffffffffffffd4c0,
              in_stack_ffffffffffffd4b8,(int)((ulong)in_stack_ffffffffffffd4b0 >> 0x20));
  }
  memset(&local_2660,0,0xc);
  local_2660.sa_family = 0x10;
  local_2660.sa_data[2] = '\0';
  local_2660.sa_data[3] = '\0';
  local_2660.sa_data[4] = '\0';
  local_2660.sa_data[5] = '\0';
  local_2660.sa_data[6] = '\0';
  local_2660.sa_data[7] = '\0';
  local_2660.sa_data[8] = '\0';
  local_2660.sa_data[9] = '\0';
  sVar4 = sendto(local_14,&local_61c,(ulong)local_61c,0,&local_2660,0xc);
  local_18 = (uint)sVar4;
  if ((int)local_18 < 0) {
    perror("netlink sendto");
    return local_18;
  }
  memset(local_2628,0,0x2000);
  if (local_20 == 4) {
    do {
      sVar4 = recv(local_14,local_2628,0x2000,0);
      local_264c = (int)sVar4;
      if (local_264c < 0) {
        perror("netlink recv");
        return local_264c;
      }
      iVar1 = parse_rtlist(in_stack_ffffffffffffd518,in_stack_ffffffffffffd510,
                           in_stack_ffffffffffffd50c);
    } while (iVar1 == 0);
  }
  else {
    sVar4 = recv(local_14,local_2628,0x2000,0);
    local_18 = (uint)sVar4;
    if ((int)local_18 < 0) {
      perror("netlink recv");
      return local_18;
    }
    local_2630 = local_2628;
    if (local_2624 != 2) {
      fprintf(_stderr,"unexpected netlink answer of type %d\n",(ulong)local_2624);
      return -0x16;
    }
    local_2638 = local_2618;
    local_18 = local_2618[0];
    if ((int)local_2618[0] < 0) {
      __errnum = local_2618[0];
      if ((int)local_2618[0] < 1) {
        __errnum = -local_2618[0];
      }
      __stream = _stderr;
      pcVar5 = strerror(__errnum);
      fprintf(__stream,"netlink error %d (%s)\n",(ulong)local_2618[0],pcVar5);
    }
  }
  close(local_14);
  return local_18;
}

Assistant:

int main(int argc, char **argv)
{
	int s;
	int err = 0;

	int opt;
	extern int optind, opterr, optopt;

	int cmd = UNSPEC;
	int have_filter = 0;
	int have_cs_xor = 0;
	int have_cs_crc8 = 0;

	struct {
		struct nlmsghdr nh;
		struct rtcanmsg rtcan;
		char buf[1500];
	} req;

	unsigned char rxbuf[8192]; /* netlink receive buffer */
	struct nlmsghdr *nlh;
	struct nlmsgerr *rte;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 uid = 0;
	__u8 limit_hops = 0;
	__u16 flags = 0;
	int len;

	struct can_filter filter;
	struct sockaddr_nl nladdr;

	struct cgw_csum_xor cs_xor = { 0 };
	struct cgw_csum_crc8 cs_crc8 = { 0 };
	char crc8tab[513] = {0};

	struct modattr modmsg[CGW_MOD_FUNCS];
	struct fdmodattr fdmodmsg[CGW_MOD_FUNCS];
	int modidx = 0;
	int fdmodidx = 0;
	int i;

	memset(&req, 0, sizeof(req));

	while ((opt = getopt(argc, argv, "ADFLs:d:Xteiu:l:f:c:p:x:m:M:?")) != -1) {
		switch (opt) {

		case 'A':
			if (cmd == UNSPEC)
				cmd = ADD;
			break;

		case 'D':
			if (cmd == UNSPEC)
				cmd = DEL;
			break;

		case 'F':
			if (cmd == UNSPEC)
				cmd = FLUSH;
			break;

		case 'L':
			if (cmd == UNSPEC)
				cmd = LIST;
			break;

		case 's':
			src_ifindex = if_nametoindex(optarg);
			if (!src_ifindex) {
				perror("src if_nametoindex");
				exit(1);
			}
			break;

		case 'd':
			dst_ifindex = if_nametoindex(optarg);
			if (!dst_ifindex) {
				perror("dst if_nametoindex");
				exit(1);
			}
			break;

		case 'X':
			flags |= CGW_FLAGS_CAN_FD;
			break;

		case 't':
			flags |= CGW_FLAGS_CAN_SRC_TSTAMP;
			break;

		case 'e':
			flags |= CGW_FLAGS_CAN_ECHO;
			break;

		case 'i':
			flags |= CGW_FLAGS_CAN_IIF_TX_OK;
			break;

		case 'u':
			uid = strtoul(optarg, NULL, 16);
			break;

		case 'l':
			if (sscanf(optarg, "%hhu", &limit_hops) != 1 || !(limit_hops)) {
				printf("Bad hop limit definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'f':
			if (sscanf(optarg, "%x:%x", &filter.can_id,
				   &filter.can_mask) == 2) {
				have_filter = 1;
			} else if (sscanf(optarg, "%x~%x", &filter.can_id,
					  &filter.can_mask) == 2) {
				filter.can_id |= CAN_INV_FILTER;
				have_filter = 1;
			} else {
				printf("Bad filter definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'x':
			if (sscanf(optarg, "%hhd:%hhd:%hhd:%hhx",
				   &cs_xor.from_idx, &cs_xor.to_idx,
				   &cs_xor.result_idx, &cs_xor.init_xor_val) == 4) {
				have_cs_xor = 1;
			} else {
				printf("Bad XOR checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'c':
			if ((sscanf(optarg, "%hhd:%hhd:%hhd:%hhx:%hhx:%512s",
				    &cs_crc8.from_idx, &cs_crc8.to_idx,
				    &cs_crc8.result_idx, &cs_crc8.init_crc_val,
				    &cs_crc8.final_xor_val, crc8tab) == 6) &&
			    (strlen(crc8tab) == 512) &&
			    (b64hex(crc8tab, (unsigned char *)&cs_crc8.crctab, 256) == 0)) {
				have_cs_crc8 = 1;
			} else {
				printf("Bad CRC8 checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'p':
			if (parse_crc8_profile(optarg, &cs_crc8)) {
				printf("Bad CRC8 profile definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'm':
			/* may be triggered by each of the CGW_MOD_FUNCS functions */
			if ((modidx < CGW_MOD_FUNCS) && (err = parse_mod(optarg, &modmsg[modidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case 'M':
			/* may be triggered by each of the CGW_FDMOD_FUNCS functions */
			if ((fdmodidx < CGW_MOD_FUNCS) && (err = parse_fdmod(optarg, &fdmodmsg[fdmodidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 0) || (cmd == UNSPEC)) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if ((cmd == ADD || cmd == DEL) &&
	    ((!src_ifindex) || (!dst_ifindex))) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if (flags & CGW_FLAGS_CAN_FD) {
		if (modidx) {
			printf("No -m modifications allowed in CAN FD mode!\n");
			exit(1);
		}
	} else {
		if (fdmodidx) {
			printf("No -M modifications allowed in Classic CAN mode!\n");
			exit(1);
		}
	}

	if ((!modidx && !fdmodidx) && (have_cs_crc8 || have_cs_xor)) {
		printf("-c or -x can only be used in conjunction with -m/-M\n");
		exit(1);
	}

	s = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE);

	switch (cmd) {

	case ADD:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_NEWROUTE;
		break;

	case DEL:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		break;

	case FLUSH:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		/* if_index set to 0 => remove all entries */
		src_ifindex  = 0;
		dst_ifindex  = 0;
		break;

	case LIST:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;
		req.nh.nlmsg_type  = RTM_GETROUTE;
		break;

	default:
		printf("This function is not yet implemented.\n");
		exit(1);
		break;
	}

	req.nh.nlmsg_len   = NLMSG_LENGTH(sizeof(struct rtcanmsg));
	req.nh.nlmsg_seq   = 0;

	req.rtcan.can_family  = AF_CAN;
	req.rtcan.gwtype = CGW_TYPE_CAN_CAN;
	req.rtcan.flags = flags;

	addattr_l(&req.nh, sizeof(req), CGW_SRC_IF, &src_ifindex, sizeof(src_ifindex));
	addattr_l(&req.nh, sizeof(req), CGW_DST_IF, &dst_ifindex, sizeof(dst_ifindex));

	/* add new attributes here */

	if (have_filter)
		addattr_l(&req.nh, sizeof(req), CGW_FILTER, &filter, sizeof(filter));

	if (have_cs_crc8)
		addattr_l(&req.nh, sizeof(req), CGW_CS_CRC8, &cs_crc8, sizeof(cs_crc8));

	if (have_cs_xor)
		addattr_l(&req.nh, sizeof(req), CGW_CS_XOR, &cs_xor, sizeof(cs_xor));

	if (uid)
		addattr_l(&req.nh, sizeof(req), CGW_MOD_UID, &uid, sizeof(__u32));

	if (limit_hops)
		addattr_l(&req.nh, sizeof(req), CGW_LIM_HOPS, &limit_hops, sizeof(__u8));

	/*
	 * a better example code
	 * modmsg.modtype = CGW_MOD_ID;
	 * addattr_l(&req.n, sizeof(req), CGW_MOD_SET, &modmsg, CGW_MODATTR_LEN);
	 */

	/* add up to CGW_MOD_FUNCS modification definitions */
	for (i = 0; i < modidx; i++)
		addattr_l(&req.nh, sizeof(req), modmsg[i].instruction, &modmsg[i], CGW_MODATTR_LEN);

	/* add up to CGW_FDMOD_FUNCS modification definitions */
	for (i = 0; i < fdmodidx; i++)
		addattr_l(&req.nh, sizeof(req), fdmodmsg[i].instruction, &fdmodmsg[i], CGW_FDMODATTR_LEN);

	memset(&nladdr, 0, sizeof(nladdr));
	nladdr.nl_family = AF_NETLINK;
	nladdr.nl_pid    = 0;
	nladdr.nl_groups = 0;

	err = sendto(s, &req, req.nh.nlmsg_len, 0,
		     (struct sockaddr*)&nladdr, sizeof(nladdr));
	if (err < 0) {
		perror("netlink sendto");
		return err;
	}

	/* clean netlink receive buffer */
	memset(rxbuf, 0x0, sizeof(rxbuf));

	if (cmd != LIST) {

		/*
		 * cmd == ADD || cmd == DEL || cmd == FLUSH
		 *
		 * Parse the requested netlink acknowledge return values.
		 */

		err = recv(s, &rxbuf, sizeof(rxbuf), 0);
		if (err < 0) {
			perror("netlink recv");
			return err;
		}
		nlh = (struct nlmsghdr *)rxbuf;
		if (nlh->nlmsg_type != NLMSG_ERROR) {
			fprintf(stderr, "unexpected netlink answer of type %d\n", nlh->nlmsg_type);
			return -EINVAL;
		}
		rte = (struct nlmsgerr *)NLMSG_DATA(nlh);
		err = rte->error;
		if (err < 0)
			fprintf(stderr, "netlink error %d (%s)\n", err, strerror(abs(err)));

	} else {

		/* cmd == LIST */

		while (1) {
			len = recv(s, &rxbuf, sizeof(rxbuf), 0);
			if (len < 0) {
				perror("netlink recv");
				return len;
			}
#if 0
			printf("received msg len %d\n", len);

			for (i = 0; i < len; i++)
				printf("%02X ", rxbuf[i]);

			printf("\n");
#endif
			/* leave on errors or NLMSG_DONE */
			if (parse_rtlist(argv[0], rxbuf, len))
				break;
		}
	}

	close(s);

	return err;
}